

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O1

void depth_free(borg_depth_line *depth)

{
  if (depth != (borg_depth_line *)0x0) {
    if (depth->condition != (math_section *)0x0) {
      mem_free(depth->condition);
      depth->condition = (math_section *)0x0;
    }
    if (depth->reason != (char *)0x0) {
      string_free(depth->reason);
      depth->reason = (char *)0x0;
    }
    mem_free(depth);
    return;
  }
  return;
}

Assistant:

static void depth_free(struct borg_depth_line *depth)
{
    if (depth) {
        if (depth->condition) {
            mem_free(depth->condition);
            depth->condition = NULL;
        }

        if (depth->reason) {
            string_free(depth->reason);
            depth->reason = NULL;
        }

        mem_free(depth);
        depth = NULL;
    }
}